

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickrst_avx2.c
# Opt level: O2

void av1_calc_proj_params_avx2
               (uint8_t *src8,int width,int height,int src_stride,uint8_t *dat8,int dat_stride,
               int32_t *flt0,int flt0_stride,int32_t *flt1,int flt1_stride,int64_t (*H) [2],
               int64_t *C,sgr_params_type *params)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  long lVar9;
  long lVar10;
  ulong uVar11;
  int j;
  long lVar12;
  ulong uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  int64_t aiVar17 [2];
  undefined1 auVar18 [32];
  undefined1 auVar19 [64];
  undefined1 auVar20 [32];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  
  if (params->r[0] < 1) {
    if (params->r[1] < 1) {
      return;
    }
    uVar13 = 0;
    uVar11 = 0;
    if (0 < height) {
      uVar11 = (ulong)(uint)height;
    }
    auVar15 = ZEXT1664((undefined1  [16])0x0);
    auVar16 = ZEXT1664((undefined1  [16])0x0);
    for (; uVar13 != uVar11; uVar13 = uVar13 + 1) {
      for (lVar12 = 0; lVar12 < width; lVar12 = lVar12 + 8) {
        auVar5._8_8_ = 0;
        auVar5._0_8_ = *(ulong *)(dat8 + lVar12);
        auVar6 = vpmovzxbd_avx2(auVar5);
        auVar14._8_8_ = 0;
        auVar14._0_8_ = *(ulong *)(src8 + lVar12);
        auVar20 = vpmovzxbd_avx2(auVar14);
        auVar24 = vpslld_avx2(auVar6,4);
        auVar7 = vpsubd_avx2(*(undefined1 (*) [32])(flt1 + lVar12),auVar24);
        auVar6 = vpsubd_avx2(auVar20,auVar6);
        auVar18 = vpslld_avx2(auVar6,4);
        auVar6 = vpmuldq_avx2(auVar7,auVar7);
        auVar24 = vpshufd_avx2(auVar7,0xf5);
        auVar20 = vpmuldq_avx2(auVar24,auVar24);
        auVar6 = vpaddq_avx2(auVar16._0_32_,auVar6);
        auVar6 = vpaddq_avx2(auVar20,auVar6);
        auVar16 = ZEXT3264(auVar6);
        auVar6 = vpmuldq_avx2(auVar18,auVar7);
        auVar20 = vpsrlq_avx2(auVar18,0x20);
        auVar20 = vpmuldq_avx2(auVar20,auVar24);
        auVar6 = vpaddq_avx2(auVar15._0_32_,auVar6);
        auVar6 = vpaddq_avx2(auVar20,auVar6);
        auVar15 = ZEXT3264(auVar6);
      }
      flt1 = flt1 + flt1_stride;
      src8 = src8 + src_stride;
      dat8 = dat8 + dat_stride;
    }
    auVar5 = vpaddq_avx(auVar16._16_16_,auVar16._0_16_);
    auVar14 = vpshufd_avx(auVar5,0xee);
    auVar5 = vpaddq_avx(auVar5,auVar14);
    auVar14 = vpaddq_avx(auVar15._16_16_,auVar15._0_16_);
    auVar1 = vpshufd_avx(auVar14,0xee);
    auVar14 = vpaddq_avx(auVar14,auVar1);
    auVar14 = vpslldq_avx(auVar14,8);
    aiVar17 = (int64_t  [2])vpslldq_avx(auVar5,8);
    *(undefined1 (*) [16])C = auVar14;
    H[1] = aiVar17;
    lVar12 = (long)(height * width);
    H[1][1] = auVar5._0_8_ / lVar12;
  }
  else {
    if (params->r[1] < 1) {
      uVar13 = 0;
      uVar11 = 0;
      if (0 < height) {
        uVar11 = (ulong)(uint)height;
      }
      auVar15 = ZEXT1664((undefined1  [16])0x0);
      auVar16 = ZEXT1664((undefined1  [16])0x0);
      for (; uVar13 != uVar11; uVar13 = uVar13 + 1) {
        for (lVar12 = 0; lVar12 < width; lVar12 = lVar12 + 8) {
          auVar3._8_8_ = 0;
          auVar3._0_8_ = *(ulong *)(dat8 + lVar12);
          auVar6 = vpmovzxbd_avx2(auVar3);
          auVar4._8_8_ = 0;
          auVar4._0_8_ = *(ulong *)(src8 + lVar12);
          auVar20 = vpmovzxbd_avx2(auVar4);
          auVar24 = vpslld_avx2(auVar6,4);
          auVar7 = vpsubd_avx2(*(undefined1 (*) [32])(flt0 + lVar12),auVar24);
          auVar6 = vpsubd_avx2(auVar20,auVar6);
          auVar18 = vpslld_avx2(auVar6,4);
          auVar6 = vpmuldq_avx2(auVar7,auVar7);
          auVar24 = vpshufd_avx2(auVar7,0xf5);
          auVar20 = vpmuldq_avx2(auVar24,auVar24);
          auVar6 = vpaddq_avx2(auVar16._0_32_,auVar6);
          auVar6 = vpaddq_avx2(auVar20,auVar6);
          auVar16 = ZEXT3264(auVar6);
          auVar6 = vpmuldq_avx2(auVar18,auVar7);
          auVar20 = vpsrlq_avx2(auVar18,0x20);
          auVar20 = vpmuldq_avx2(auVar20,auVar24);
          auVar6 = vpaddq_avx2(auVar15._0_32_,auVar6);
          auVar6 = vpaddq_avx2(auVar20,auVar6);
          auVar15 = ZEXT3264(auVar6);
        }
        flt0 = flt0 + flt0_stride;
        src8 = src8 + src_stride;
        dat8 = dat8 + dat_stride;
      }
      auVar5 = vpaddq_avx(auVar16._16_16_,auVar16._0_16_);
      auVar14 = vpshufd_avx(auVar5,0xee);
      auVar5 = vpaddq_avx(auVar5,auVar14);
      auVar14 = vpaddq_avx(auVar15._16_16_,auVar15._0_16_);
      auVar1 = vpshufd_avx(auVar14,0xee);
      auVar14 = vpaddq_avx(auVar14,auVar1);
      *C = auVar14._0_8_;
      C[1] = 0;
      (*H)[0] = auVar5._0_8_;
      (*H)[1] = 0;
      lVar12 = (long)(height * width);
      (*H)[0] = auVar5._0_8_ / lVar12;
      goto LAB_003f34ae;
    }
    uVar13 = 0;
    uVar11 = 0;
    if (0 < height) {
      uVar11 = (ulong)(uint)height;
    }
    auVar16 = ZEXT1664((undefined1  [16])0x0);
    auVar22 = ZEXT1664((undefined1  [16])0x0);
    auVar15 = ZEXT1664((undefined1  [16])0x0);
    auVar19 = ZEXT1664((undefined1  [16])0x0);
    auVar21 = ZEXT1664((undefined1  [16])0x0);
    for (; uVar13 != uVar11; uVar13 = uVar13 + 1) {
      for (lVar12 = 0; lVar12 < width; lVar12 = lVar12 + 8) {
        auVar1._8_8_ = 0;
        auVar1._0_8_ = *(ulong *)(dat8 + lVar12);
        auVar6 = vpmovzxbd_avx2(auVar1);
        auVar2._8_8_ = 0;
        auVar2._0_8_ = *(ulong *)(src8 + lVar12);
        auVar20 = vpmovzxbd_avx2(auVar2);
        auVar24 = vpslld_avx2(auVar6,4);
        auVar6 = vpsubd_avx2(auVar20,auVar6);
        auVar23 = vpslld_avx2(auVar6,4);
        auVar18 = vpsubd_avx2(*(undefined1 (*) [32])(flt0 + lVar12),auVar24);
        auVar8 = vpsubd_avx2(*(undefined1 (*) [32])(flt1 + lVar12),auVar24);
        auVar6 = vpmuldq_avx2(auVar18,auVar18);
        auVar24 = vpshufd_avx2(auVar18,0xf5);
        auVar20 = vpmuldq_avx2(auVar24,auVar24);
        auVar6 = vpaddq_avx2(auVar6,auVar21._0_32_);
        auVar6 = vpaddq_avx2(auVar20,auVar6);
        auVar21 = ZEXT3264(auVar6);
        auVar6 = vpmuldq_avx2(auVar8,auVar18);
        auVar7 = vpshufd_avx2(auVar8,0xf5);
        auVar20 = vpmuldq_avx2(auVar7,auVar24);
        auVar6 = vpaddq_avx2(auVar6,auVar19._0_32_);
        auVar6 = vpaddq_avx2(auVar20,auVar6);
        auVar19 = ZEXT3264(auVar6);
        auVar6 = vpmuldq_avx2(auVar8,auVar8);
        auVar20 = vpmuldq_avx2(auVar7,auVar7);
        auVar6 = vpaddq_avx2(auVar6,auVar15._0_32_);
        auVar6 = vpaddq_avx2(auVar20,auVar6);
        auVar15 = ZEXT3264(auVar6);
        auVar6 = vpmuldq_avx2(auVar23,auVar18);
        auVar18 = vpshufd_avx2(auVar23,0xf5);
        auVar20 = vpmuldq_avx2(auVar18,auVar24);
        auVar6 = vpaddq_avx2(auVar22._0_32_,auVar6);
        auVar6 = vpaddq_avx2(auVar20,auVar6);
        auVar22 = ZEXT3264(auVar6);
        auVar6 = vpmuldq_avx2(auVar8,auVar23);
        auVar20 = vpmuldq_avx2(auVar7,auVar18);
        auVar6 = vpaddq_avx2(auVar16._0_32_,auVar6);
        auVar6 = vpaddq_avx2(auVar20,auVar6);
        auVar16 = ZEXT3264(auVar6);
      }
      flt1 = flt1 + flt1_stride;
      flt0 = flt0 + flt0_stride;
      src8 = src8 + src_stride;
      dat8 = dat8 + dat_stride;
    }
    auVar20 = vpunpcklqdq_avx2(auVar22._0_32_,auVar16._0_32_);
    auVar6 = vpunpckhqdq_avx2(auVar22._0_32_,auVar16._0_32_);
    auVar6 = vpaddq_avx2(auVar20,auVar6);
    auVar5 = vpaddq_avx(auVar6._16_16_,auVar6._0_16_);
    auVar20 = vpunpcklqdq_avx2(auVar21._0_32_,auVar19._0_32_);
    auVar6 = vpunpckhqdq_avx2(auVar21._0_32_,auVar19._0_32_);
    auVar6 = vpaddq_avx2(auVar20,auVar6);
    auVar14 = vpaddq_avx(auVar6._16_16_,auVar6._0_16_);
    auVar20 = vpslldq_avx2(auVar15._0_32_,8);
    auVar6 = vpblendd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar15._0_32_,0xcc);
    auVar6 = vpaddq_avx2(auVar20,auVar6);
    auVar1 = vpaddq_avx(auVar6._16_16_,auVar6._0_16_);
    *(undefined1 (*) [16])C = auVar5;
    lVar12 = (long)(height * width);
    (*H)[0] = auVar14._0_8_ / lVar12;
    lVar9 = vpextrq_avx(auVar14,1);
    (*H)[1] = lVar9 / lVar12;
    lVar10 = vpextrq_avx(auVar1,1);
    H[1][1] = lVar10 / lVar12;
    H[1][0] = lVar9 / lVar12;
    *C = *C / lVar12;
  }
  C = C + 1;
LAB_003f34ae:
  *C = *C / lVar12;
  return;
}

Assistant:

void av1_calc_proj_params_avx2(const uint8_t *src8, int width, int height,
                               int src_stride, const uint8_t *dat8,
                               int dat_stride, int32_t *flt0, int flt0_stride,
                               int32_t *flt1, int flt1_stride, int64_t H[2][2],
                               int64_t C[2], const sgr_params_type *params) {
  if ((params->r[0] > 0) && (params->r[1] > 0)) {
    calc_proj_params_r0_r1_avx2(src8, width, height, src_stride, dat8,
                                dat_stride, flt0, flt0_stride, flt1,
                                flt1_stride, H, C);
  } else if (params->r[0] > 0) {
    calc_proj_params_r0_avx2(src8, width, height, src_stride, dat8, dat_stride,
                             flt0, flt0_stride, H, C);
  } else if (params->r[1] > 0) {
    calc_proj_params_r1_avx2(src8, width, height, src_stride, dat8, dat_stride,
                             flt1, flt1_stride, H, C);
  }
}